

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmloutput.cpp
# Opt level: O0

void __thiscall XmlOutput::addAttributeTag(XmlOutput *this,QString *attribute,QString *value)

{
  qsizetype qVar1;
  char *pcVar2;
  QTextStream *pQVar3;
  QString *in_RDI;
  long in_FS_OFFSET;
  QList<QString> *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  QMessageLogger *in_stack_ffffffffffffff40;
  char *local_b8;
  bool local_a1;
  XmlOutput *in_stack_ffffffffffffff78;
  undefined1 local_70 [72];
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(uint *)((long)&in_RDI[2].d.ptr + 4) < 2) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               (int)((ulong)in_stack_ffffffffffffff30 >> 0x20),(char *)in_stack_ffffffffffffff28);
    qVar1 = QList<QString>::size((QList<QString> *)(in_RDI + 3));
    if (qVar1 == 0) {
      local_b8 = "Root";
    }
    else {
      QList<QString>::last(in_stack_ffffffffffffff28);
      QString::toLatin1((QString *)in_stack_ffffffffffffff28);
      local_b8 = QByteArray::constData((QByteArray *)0x2c28a4);
    }
    local_a1 = qVar1 != 0;
    QString::toLatin1((QString *)in_stack_ffffffffffffff28);
    pcVar2 = QByteArray::constData((QByteArray *)0x2c28e2);
    QMessageLogger::debug
              (local_28,"<%s>: Cannot add attribute (%s) since tag\'s not open",local_b8,pcVar2);
    QByteArray::~QByteArray((QByteArray *)0x2c290d);
    if (local_a1) {
      QByteArray::~QByteArray((QByteArray *)0x2c2923);
    }
  }
  else {
    pQVar3 = (QTextStream *)QTextStream::operator<<((QTextStream *)(in_RDI->d).d," ");
    doConversion(in_stack_ffffffffffffff78,in_RDI);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)local_70);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"=\"");
    doConversion(in_stack_ffffffffffffff78,in_RDI);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&stack0xffffffffffffff78);
    QTextStream::operator<<(pQVar3,"\"");
    QString::~QString((QString *)0x2c29b6);
    QString::~QString((QString *)0x2c29c0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void XmlOutput::addAttributeTag(const QString &attribute, const QString &value)
{
     switch(currentState) {
        case Bare:
        case Tag:
            //warn_msg(WarnLogic, "<%s>: Cannot add attribute since tags not open", tagStack.last().toLatin1().constData());
            qDebug("<%s>: Cannot add attribute (%s) since tag's not open",
                   (tagStack.size() ? tagStack.last().toLatin1().constData() : "Root"),
                   attribute.toLatin1().constData());
            return;
        case Attribute:
            break;
    }
    xmlFile << " " << doConversion(attribute) << "=\"" << doConversion(value) << "\"";
}